

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O0

IterationConfig * __thiscall
deqp::gles31::Functional::anon_unknown_1::LineRenderCase::generateConfig
          (IterationConfig *__return_storage_ptr__,LineRenderCase *this,int iteration,
          IVec2 *renderTargetSize)

{
  int iVar1;
  float fVar2;
  IterationConfig local_78;
  IterationConfig *local_38;
  IterationConfig *config;
  int attemptNdx;
  int numMaxAttempts;
  IVec2 *renderTargetSize_local;
  LineRenderCase *pLStack_18;
  int iteration_local;
  LineRenderCase *this_local;
  
  config._4_4_ = 0x80;
  config._0_4_ = 0;
  _attemptNdx = renderTargetSize;
  renderTargetSize_local._4_4_ = iteration;
  pLStack_18 = this;
  this_local = (LineRenderCase *)__return_storage_ptr__;
  do {
    if (0x7f < (int)config) {
      memset(__return_storage_ptr__,0,0x40);
      BBoxRenderCase::IterationConfig::IterationConfig(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    BBoxRenderCase::generateRandomConfig
              (&local_78,&this->super_BBoxRenderCase,
               renderTargetSize_local._4_4_ * 0xdedede ^ (int)config * 0xabab13,_attemptNdx);
    local_38 = &local_78;
    iVar1 = tcu::Vector<int,_2>::x(&local_78.viewportSize);
    fVar2 = tcu::Vector<float,_2>::x(&local_38->patternSize);
    if ((float)*(int *)&(this->super_BBoxRenderCase).field_0xd4 * 2.5 *
        (float)this->m_wideLineLineWidth < (float)iVar1 * fVar2 * 0.5) {
      iVar1 = tcu::Vector<int,_2>::y(&local_38->viewportSize);
      fVar2 = tcu::Vector<float,_2>::y(&local_38->patternSize);
      if ((float)*(int *)&(this->super_BBoxRenderCase).field_0xd4 * 2.5 *
          (float)this->m_wideLineLineWidth < (float)iVar1 * fVar2 * 0.5) {
        BBoxRenderCase::IterationConfig::IterationConfig(__return_storage_ptr__,local_38);
        return __return_storage_ptr__;
      }
    }
    config._0_4_ = (int)config + 1;
  } while( true );
}

Assistant:

LineRenderCase::IterationConfig LineRenderCase::generateConfig (int iteration, const tcu::IVec2& renderTargetSize) const
{
	const int numMaxAttempts = 128;

	// Avoid too narrow viewports, lines could merge together. Require viewport is at least 2.5x the size of the line bodies.
	for (int attemptNdx = 0; attemptNdx < numMaxAttempts; ++attemptNdx)
	{
		const IterationConfig& config = generateRandomConfig((0xDEDEDEu * (deUint32)iteration) ^ (0xABAB13 * attemptNdx), renderTargetSize);

		if ((float)config.viewportSize.x() * (config.patternSize.x() * 0.5f) > 2.5f * (float)m_patternSide * (float)m_wideLineLineWidth &&
			(float)config.viewportSize.y() * (config.patternSize.y() * 0.5f) > 2.5f * (float)m_patternSide * (float)m_wideLineLineWidth)
		{
			return config;
		}
	}

	DE_ASSERT(false);
	return IterationConfig();
}